

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

string * __thiscall
absl::lts_20240722::str_format_internal::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,UntypedFormatSpecImpl format,
          Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> args)

{
  str_format_internal *p;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  pointer pFVar6;
  int *next_arg_00;
  code *pcVar7;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  code *extraout_RDX_02;
  str_format_internal *end;
  char *pcVar8;
  byte bVar9;
  ConversionItem *item;
  char *pcVar10;
  char *pcVar11;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  int next_arg;
  string out;
  FormatSinkImpl sink;
  int local_4a4;
  string *local_4a0;
  UnboundConversion local_498;
  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  local_488;
  _Alloc_hider local_470;
  size_type local_468;
  char local_460;
  undefined7 uStack_45f;
  undefined8 uStack_458;
  FormatSinkImpl local_450;
  code *extraout_RDX_01;
  
  local_488.arg_context_.pack_.len_ = (size_type)args.ptr_;
  pFVar6 = (pointer)format.size_;
  pvVar5 = format.data_;
  local_470._M_p = &local_460;
  local_468 = 0;
  local_460 = '\0';
  local_450.raw_.sink_ = &local_470;
  local_450.pos_ = local_450.buf_;
  pcVar7 = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  local_450.raw_.write_ = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  local_450.size_ = 0;
  local_488.converter_.sink_ = &local_450;
  local_488.arg_context_.pack_.ptr_ = pFVar6;
  if (pvVar5 == (void *)0xffffffffffffffff) {
    pcVar10 = *(char **)(this + 0x10);
    pcVar1 = *(char **)(this + 0x18);
    local_4a0 = __return_storage_ptr__;
    if (pcVar10 != pcVar1) {
      pcVar2 = *(char **)(this + 8);
      pcVar11 = (char *)0x0;
      pcVar8 = pcVar2;
      do {
        pcVar8 = pcVar8 + (long)pcVar11;
        pcVar11 = pcVar2 + (*(long *)(pcVar10 + 8) - (long)pcVar8);
        if (*pcVar10 == '\x01') {
          conv_string_01._M_str = (char *)pFVar6;
          conv_string_01._M_len = (size_t)pcVar7;
          bVar4 = anon_unknown_3::
                  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                  ::ConvertOne(&local_488,(UnboundConversion *)(pcVar10 + 0x10),conv_string_01);
          pcVar7 = extraout_RDX_01;
          if (!bVar4) {
            bVar9 = 0;
            __return_storage_ptr__ = local_4a0;
            goto LAB_0010a7e5;
          }
        }
        else {
          v_02._M_str = pcVar8;
          v_02._M_len = (size_t)pcVar11;
          FormatSinkImpl::Append(local_488.converter_.sink_,v_02);
          pcVar7 = extraout_RDX_02;
        }
        pcVar10 = pcVar10 + 0x20;
      } while (pcVar10 != pcVar1);
    }
    bVar9 = (byte)*this ^ 1;
    __return_storage_ptr__ = local_4a0;
  }
  else {
    local_4a4 = 0;
    bVar9 = 1;
    if (pvVar5 != (void *)0x0) {
      end = (str_format_internal *)((long)pvVar5 + (long)this);
      local_4a0 = __return_storage_ptr__;
      do {
        pvVar5 = memchr(this,0x25,(long)end - (long)this);
        if (pvVar5 == (void *)0x0) {
          v_00._M_str = (char *)this;
          v_00._M_len = (long)end - (long)this;
          FormatSinkImpl::Append(local_488.converter_.sink_,v_00);
          bVar4 = true;
          bVar9 = 1;
        }
        else {
          v._M_len = (long)pvVar5 - (long)this;
          v._M_str = (char *)this;
          FormatSinkImpl::Append(local_488.converter_.sink_,v);
          p = (str_format_internal *)((long)pvVar5 + 1);
          bVar4 = true;
          if (p < end) {
            if ((char)ConvTagHolder::value[(byte)*p].tag_ < '\0') {
              if (*p == (str_format_internal)0x25) {
                v_01._M_str = "%";
                v_01._M_len = 1;
                FormatSinkImpl::Append(local_488.converter_.sink_,v_01);
                this = (str_format_internal *)((long)pvVar5 + 2);
                bVar4 = false;
              }
              else {
                local_498.width.value_ = -1;
                local_498.precision.value_ = -1;
                local_498.flags = kBasic;
                local_498.length_mod = none;
                local_498.conv = 0x13;
                next_arg_00 = &local_4a4;
                this = (str_format_internal *)
                       ConsumeUnboundConversionNoInline
                                 ((char *)p,(char *)end,&local_498,next_arg_00);
                if (this == (str_format_internal *)0x0) {
                  bVar9 = 0;
                  bVar3 = false;
                }
                else {
                  conv_string_00._M_str = (char *)next_arg_00;
                  conv_string_00._M_len = extraout_RDX_00;
                  bVar3 = anon_unknown_3::
                          ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                          ::ConvertOne(&local_488,&local_498,conv_string_00);
                  bVar9 = bVar9 & bVar3;
                }
                if (bVar3 != false) goto LAB_0010a72a;
              }
            }
            else {
              if (local_4a4 < 0) goto LAB_0010a745;
              local_498.width.value_ = -1;
              local_498.precision.value_ = -1;
              local_498.flags = kBasic;
              local_498.length_mod = none;
              conv_string._M_str._0_4_ = local_4a4 + 1;
              conv_string._M_len = extraout_RDX;
              conv_string._M_str._4_4_ = 0;
              local_4a4 = (int)conv_string._M_str;
              local_498.arg_position = (int)conv_string._M_str;
              local_498.conv = ConvTagHolder::value[(byte)*p].tag_;
              bVar3 = anon_unknown_3::
                      ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                      ::ConvertOne(&local_488,&local_498,conv_string);
              this = (str_format_internal *)((long)pvVar5 + 2);
              bVar9 = bVar9 & bVar3;
              if (bVar3) {
LAB_0010a72a:
                bVar4 = false;
              }
            }
          }
          else {
LAB_0010a745:
            bVar9 = 0;
          }
        }
        __return_storage_ptr__ = local_4a0;
        if (bVar4) goto LAB_0010a7e5;
      } while (this != end);
      bVar9 = 1;
    }
  }
LAB_0010a7e5:
  if ((bVar9 & 1) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    FormatSinkImpl::~FormatSinkImpl(&local_450);
    if ((bVar9 & 1) == 0) goto LAB_0010a861;
  }
  else {
    FormatSinkImpl::~FormatSinkImpl(&local_450);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_470._M_p == &local_460) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_45f,local_460);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_458;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_470._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_45f,local_460);
  }
  __return_storage_ptr__->_M_string_length = local_468;
  local_468 = 0;
  local_460 = '\0';
  local_470._M_p = &local_460;
LAB_0010a861:
  if (local_470._M_p != &local_460) {
    operator_delete(local_470._M_p,CONCAT71(uStack_45f,local_460) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Summarize(const UntypedFormatSpecImpl format,
                      absl::Span<const FormatArgImpl> args) {
  typedef SummarizingConverter Converter;
  std::string out;
  {
    // inner block to destroy sink before returning out. It ensures a last
    // flush.
    FormatSinkImpl sink(&out);
    if (!ConvertAll(format, args, Converter(&sink))) {
      return "";
    }
  }
  return out;
}